

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

char * __thiscall CVmTimeZone::get_name(CVmTimeZone *this,size_t *len)

{
  size_t sVar1;
  char **ppcVar2;
  char *__s;
  
  __s = this->name_;
  if (__s == (char *)0x0) {
    if (this->hashentry_ != (ZoneHashEntry *)0x0) {
      *len = (this->hashentry_->super_CVmHashEntryCI).super_CVmHashEntry.len_;
      ppcVar2 = &(this->hashentry_->super_CVmHashEntryCI).super_CVmHashEntry.str_;
      goto LAB_0026089d;
    }
    __s = this->abbr_;
    ppcVar2 = &this->abbr_;
  }
  else {
    ppcVar2 = &this->name_;
  }
  sVar1 = strlen(__s);
  *len = sVar1;
LAB_0026089d:
  return *ppcVar2;
}

Assistant:

const char *CVmTimeZone::get_name(size_t &len) const
{
    /* use the name, or the hash table name, or the primary abbreviation */
    if (name_ != 0)
    {
        /* we have an explicit name field - use it */
        len = strlen(name_);
        return name_;
    }
    else if (hashentry_ != 0)
    {
        /* get the name from our hash table entry */
        len = hashentry_->getlen();
        return hashentry_->getstr();
    }
    else
    {
        /* no name or hash entry - use our primary abbreviation */
        len = strlen(abbr_);
        return abbr_;
    }
}